

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void uECC_vli_rshift1(uECC_word_t *vli,wordcount_t num_words)

{
  ulong uVar1;
  ulong *puVar2;
  uECC_word_t temp;
  uECC_word_t carry;
  uECC_word_t *end;
  ulong *puStack_10;
  wordcount_t num_words_local;
  uECC_word_t *vli_local;
  
  temp = 0;
  puStack_10 = vli + (int)num_words;
  while (puVar2 = puStack_10 + -1, vli < puStack_10) {
    uVar1 = *puVar2;
    *puVar2 = uVar1 >> 1 | temp;
    temp = uVar1 << 0x3f;
    puStack_10 = puVar2;
  }
  return;
}

Assistant:

uECC_VLI_API void uECC_vli_rshift1(uECC_word_t *vli, wordcount_t num_words) {
    uECC_word_t *end = vli;
    uECC_word_t carry = 0;

    vli += num_words;
    while (vli-- > end) {
        uECC_word_t temp = *vli;
        *vli = (temp >> 1) | carry;
        carry = temp << (uECC_WORD_BITS - 1);
    }
}